

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplePartitionMap.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Storage::MassStorage::Encodings::Apple::
PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider>::convert_source_block
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider> *this,
          ssize_t source_address,vector<unsigned_char,_std::allocator<unsigned_char>_> *source_data)

{
  undefined1 *this_00;
  undefined4 uVar1;
  pointer puVar2;
  VolumeProvider *this_01;
  uint16_t uVar3;
  ssize_t sVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  uint8_t *puVar8;
  uchar uVar9;
  ulong uVar10;
  initializer_list<unsigned_char> __l;
  undefined8 auStack_b8 [2];
  undefined4 uStack_a8;
  allocator_type local_a1;
  VolumeProvider *local_a0;
  Partition partitions [3];
  
  if (source_address < 0) {
    auStack_b8[1] = 0x3e70f9;
    sVar4 = non_volume_blocks(this);
    uVar10 = sVar4 + source_address;
    if (uVar10 == 0) {
      auStack_b8[1] = 0x3e733a;
      sVar6 = get_number_of_blocks(this);
      auStack_b8[1] = 0x3e7345;
      sVar4 = driver_block_size(this);
      partitions[0].start_block._1_1_ = (short)sVar4 != 0;
      partitions[0].name =
           (char *)CONCAT17((char)sVar6,
                            CONCAT16((char)(sVar6 >> 8),
                                     CONCAT15((char)(sVar6 >> 0x10),
                                              CONCAT14((char)(sVar6 >> 0x18),0x25245))));
      partitions[0].type = (char *)0x1000100;
      partitions[0].start_block._0_1_ = 0;
      partitions[0].start_block._2_2_ = 0;
      partitions[0].size._0_2_ = 0x4000;
      partitions[0].size._2_1_ = (undefined1)((ulong)sVar4 >> 8);
      partitions[0].size._3_1_ = (undefined1)sVar4;
      partitions[0].status = '\0';
      partitions[0]._25_1_ = 1;
      auStack_b8[1] = 0x3e73a7;
      __l._M_len = 0x1a;
      __l._M_array = (iterator)partitions;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (__return_storage_ptr__,__l,&local_a1);
      auStack_b8[1] = 0x3e73b4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (__return_storage_ptr__,0x200);
    }
    else if ((long)uVar10 < 4) {
      this_00 = &this->field_0x10;
      auStack_b8[1] = 0x3e711c;
      partitions[0].name = Macintosh::VolumeProvider::name((VolumeProvider *)this_00);
      auStack_b8[1] = 0x3e712e;
      local_a0 = (VolumeProvider *)this_00;
      partitions[0].type = Macintosh::VolumeProvider::type((VolumeProvider *)this_00);
      auStack_b8[1] = 0x3e713b;
      sVar4 = non_volume_blocks(this);
      partitions[0].start_block._0_1_ = (undefined1)sVar4;
      partitions[0].start_block._1_1_ = (undefined1)((ulong)sVar4 >> 8);
      partitions[0].start_block._2_2_ = (undefined2)((ulong)sVar4 >> 0x10);
      uVar1 = (undefined4)this->number_of_blocks_;
      partitions[0].size._0_2_ = (undefined2)uVar1;
      partitions[0].size._2_1_ = (undefined1)((uint)uVar1 >> 0x10);
      partitions[0].size._3_1_ = (undefined1)((uint)uVar1 >> 0x18);
      partitions[0].status = 0xb7;
      partitions[1].name = "Apple";
      partitions[1].type = "Apple_partition_map";
      partitions[1].start_block = 1;
      partitions[1].size = 0x3f;
      partitions[1].status = '7';
      partitions[2].name = "Macintosh";
      partitions[2].type = "Apple_Driver";
      partitions[2].start_block = 0x40;
      auStack_b8[1] = 0x3e71a1;
      sVar4 = driver_block_size(this);
      partitions[2].size = (uint32_t)sVar4;
      partitions[2].status = '\x7f';
      auStack_b8[1] = 0x3e71bc;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (__return_storage_ptr__,0x200,&local_a1);
      *(__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
       _M_impl.super__Vector_impl_data._M_start = 'P';
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[1] = 'M';
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[7] = '\x03';
      uVar1 = (&uStack_a8)[uVar10 * 8];
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[8] = (uchar)((uint)uVar1 >> 0x18);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[9] = (uchar)((uint)uVar1 >> 0x10);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[10] = (uchar)((uint)uVar1 >> 8);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[0xb] = (uchar)uVar1;
      uVar1 = *(undefined4 *)(&stack0xffffffffffffff5c + uVar10 * 0x20);
      uVar9 = (uchar)((uint)uVar1 >> 0x18);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[0xc] = uVar9;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[0x54] = uVar9;
      uVar9 = (uchar)((uint)uVar1 >> 0x10);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[0xd] = uVar9;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[0x55] = uVar9;
      uVar9 = (uchar)((uint)uVar1 >> 8);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[0xe] = uVar9;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[0x56] = uVar9;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[0xf] = (uchar)uVar1;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[0x57] = (uchar)uVar1;
      puVar2 = (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar7 = (char *)auStack_b8[uVar10 * 4];
      auStack_b8[1] = 0x3e725b;
      sVar5 = strlen(pcVar7);
      auStack_b8[1] = 0x3e7269;
      memcpy(puVar2 + 0x10,pcVar7,sVar5);
      puVar2 = (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar7 = (char *)auStack_b8[uVar10 * 4 + 1];
      auStack_b8[1] = 0x3e727d;
      sVar5 = strlen(pcVar7);
      auStack_b8[1] = 0x3e728b;
      memcpy(puVar2 + 0x30,pcVar7,sVar5);
      this_01 = local_a0;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[0x5b] = partitions[uVar10 - 1].status;
      if (uVar10 == 3) {
        auStack_b8[1] = 0x3e72ad;
        sVar6 = Macintosh::VolumeProvider::driver_size(local_a0);
        auStack_b8[1] = 0x3e72b8;
        uVar3 = Macintosh::VolumeProvider::driver_checksum(this_01);
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x62] = (uchar)(sVar6 >> 8);
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[99] = (uchar)sVar6;
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x76] = (uchar)(uVar3 >> 8);
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x77] = (uchar)uVar3;
        auStack_b8[1] = 0x3e72db;
        pcVar7 = Macintosh::VolumeProvider::driver_target(this_01);
        puVar2 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        auStack_b8[1] = 0x3e72ed;
        sVar5 = strlen(pcVar7);
        auStack_b8[1] = 0x3e72fb;
        memcpy(puVar2 + 0x78,pcVar7,sVar5);
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x89] = '\x01';
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x8a] = '\x06';
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x8f] = '\x01';
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x93] = '\x02';
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x95] = '\a';
      }
    }
    else {
      if (0x3f < uVar10) {
        auStack_b8[1] = 0x3e73c7;
        sVar4 = non_volume_blocks(this);
        if ((long)uVar10 < sVar4) {
          auStack_b8[1] = 0x3e73d8;
          puVar8 = Macintosh::VolumeProvider::driver((VolumeProvider *)&this->field_0x10);
          auStack_b8[1] = 0x3e73ff;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     puVar8 + uVar10 * 0x200 + -0x8000,puVar8 + uVar10 * 0x200 + -0x7e00,
                     (allocator_type *)partitions);
          return __return_storage_ptr__;
        }
      }
      auStack_b8[1] = 0x3e7416;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (__return_storage_ptr__,0x200,(allocator_type *)partitions);
    }
  }
  else {
    puVar2 = (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start =
         (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> convert_source_block(ssize_t source_address, std::vector<uint8_t> source_data = {}) {
			// Addresses greater than or equal to zero map to the actual disk image.
			if(source_address >= 0) return source_data;

			// Switch to mapping relative to 0, for personal sanity.
			source_address += non_volume_blocks();

			// Block 0 is the device descriptor, which lists the total number of blocks,
			// and provides an offset to the driver, if any.
			if(!source_address) {
				const uint32_t total_device_blocks = uint32_t(get_number_of_blocks());
				const auto driver_size = uint16_t(driver_block_size());
				const auto driver_offset = uint16_t(predriver_blocks());
				const uint8_t driver_count = driver_size > 0 ? 1 : 0;

				/* The driver descriptor. */
				std::vector<uint8_t> driver_description = {
					0x45, 0x52,		/* device signature */
					0x02, 0x00,		/* block size, in bytes */

					uint8_t(total_device_blocks >> 24),
					uint8_t(total_device_blocks >> 16),
					uint8_t(total_device_blocks >> 8),
					uint8_t(total_device_blocks),
									/* number of blocks on device */

					0x00, 0x01,		/* reserved (formerly: device type) */
					0x00, 0x01,		/* reserved (formerly: device ID) */
					0x00, 0x00,
					0x00, 0x00,		/* reserved ('sbData', no further explanation given) */

					0x00, driver_count,		/* number of device descriptor entries */
					0x00, 0x00,

					/* first device descriptor's starting block */
					uint8_t(driver_offset >> 8), uint8_t(driver_offset),

					/* size of device driver */
					uint8_t(driver_size >> 8), uint8_t(driver_size),

					0x00, 0x01,		/*
										More modern documentation: operating system (MacOS = 1)
										Inside Macintosh IV: system type (Mac Plus = 1)
									*/
				};
				driver_description.resize(512);

				return driver_description;
			}

			// Blocks 1 and 2 contain entries of the partition map; there's also possibly an entry
			// for the driver.
			if(source_address < 3 + volume_provider_.HasDriver) {
				struct Partition {
					const char *name, *type;
					uint32_t start_block, size;
					uint8_t status;
				} partitions[3] = {
					{
						volume_provider_.name(),
						volume_provider_.type(),
						uint32_t(non_volume_blocks()),
						uint32_t(number_of_blocks_),
						0xb7
					},
					{
						"Apple",
						"Apple_partition_map",
						0x01,
						uint32_t(predriver_blocks()) - 1,
						0x37
					},
					{
						"Macintosh",
						"Apple_Driver",
						uint32_t(predriver_blocks()),
						uint32_t(driver_block_size()),
						0x7f
					},
				};

				std::vector<uint8_t> partition(512);

				// Fill in the fixed fields.
				partition[0] = 'P';	partition[1] = 'M';	/* Signature. */
				partition[7] = 3;						/* Number of partitions. */

				const Partition &details = partitions[source_address-1];

				partition[8] = uint8_t(details.start_block >> 24);
				partition[9] = uint8_t(details.start_block >> 16);
				partition[10] = uint8_t(details.start_block >> 8);
				partition[11] = uint8_t(details.start_block);

				partition[84] = partition[12] = uint8_t(details.size >> 24);
				partition[85] = partition[13] = uint8_t(details.size >> 16);
				partition[86] = partition[14] = uint8_t(details.size >> 8);
				partition[87] = partition[15] = uint8_t(details.size);

				// 32 bytes are allocated for each of the following strings.
				memcpy(&partition[16], details.name, strlen(details.name));
				memcpy(&partition[48], details.type, strlen(details.type));

				partition[91] = details.status;

				// The third entry in this constructed partition map is the driver;
				// add some additional details.
				if constexpr (VolumeProvider::HasDriver) {
					if(source_address == 3) {
						const auto driver_size = uint16_t(volume_provider_.driver_size());
						const auto driver_checksum = uint16_t(volume_provider_.driver_checksum());

						/* Driver size in bytes. */
						partition[98] = uint8_t(driver_size >> 8);
						partition[99] = uint8_t(driver_size);

						/* Driver checksum. */
						partition[118] = uint8_t(driver_checksum >> 8);
						partition[119] = uint8_t(driver_checksum);

						/* Driver target processor. */
						const char *driver_target = volume_provider_.driver_target();
						memcpy(&partition[120], driver_target, strlen(driver_target));

						// Various non-zero values that Apple HD SC Tool wrote are below; they are
						// documented as reserved officially, so I don't know their meaning.
						partition[137] = 0x01;
						partition[138] = 0x06;
						partition[143] = 0x01;
						partition[147] = 0x02;
						partition[149] = 0x07;
					}
				}

				return partition;
			}

			if constexpr (VolumeProvider::HasDriver) {
				// The remainder of the non-volume area is the driver.
				if(source_address >= predriver_blocks() && source_address < non_volume_blocks()) {
					const uint8_t *driver = volume_provider_.driver();
					const auto offset = (source_address - predriver_blocks()) * 512;
					return std::vector<uint8_t>(&driver[offset], &driver[offset + 512]);
				}
			}

			// Default: return an empty block.
			return std::vector<uint8_t>(512);
		}